

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_util.cpp
# Opt level: O0

void spirv_cross_util::rename_interface_variable
               (Compiler *compiler,SmallVector<spirv_cross::Resource,_8UL> *resources,
               uint32_t location,string *name)

{
  uint uVar1;
  uint index;
  SmallVector<spirv_cross::Resource,_8UL> *pSVar2;
  bool bVar3;
  size_t sVar4;
  spirv_cross local_c0 [36];
  TypeID local_9c;
  uint local_98 [2];
  uint32_t i;
  spirv_cross local_88 [32];
  ID local_68;
  uint32_t local_64;
  SPIRType *local_60;
  SPIRType *type;
  uint32_t local_50;
  uint32_t local_4c;
  uint32_t loc;
  Resource *v;
  Resource *__end1;
  Resource *__begin1;
  SmallVector<spirv_cross::Resource,_8UL> *__range1;
  string *name_local;
  SmallVector<spirv_cross::Resource,_8UL> *pSStack_18;
  uint32_t location_local;
  SmallVector<spirv_cross::Resource,_8UL> *resources_local;
  Compiler *compiler_local;
  
  __begin1 = (Resource *)resources;
  __range1 = (SmallVector<spirv_cross::Resource,_8UL> *)name;
  name_local._4_4_ = location;
  pSStack_18 = resources;
  resources_local = (SmallVector<spirv_cross::Resource,_8UL> *)compiler;
  __end1 = spirv_cross::VectorView<spirv_cross::Resource>::begin
                     (&resources->super_VectorView<spirv_cross::Resource>);
  v = spirv_cross::VectorView<spirv_cross::Resource>::end
                ((VectorView<spirv_cross::Resource> *)__begin1);
  for (; __end1 != v; __end1 = __end1 + 1) {
    _loc = __end1;
    local_4c = (__end1->id).id;
    bVar3 = spirv_cross::Compiler::has_decoration
                      ((Compiler *)resources_local,(ID)local_4c,DecorationLocation);
    if (bVar3) {
      type._4_4_ = (_loc->id).id;
      local_50 = spirv_cross::Compiler::get_decoration
                           ((Compiler *)resources_local,type._4_4_,DecorationLocation);
      if (local_50 == name_local._4_4_) {
        local_64 = (_loc->base_type_id).id;
        local_60 = spirv_cross::Compiler::get_type((Compiler *)resources_local,(TypeID)local_64);
        pSVar2 = resources_local;
        if (local_60->basetype == Struct) {
          spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
                    (&local_68,&_loc->base_type_id);
          spirv_cross::join<char_const(&)[31],unsigned_int&>
                    (local_88,(char (*) [31])"SPIRV_Cross_Interface_Location",
                     (uint *)((long)&name_local + 4));
          spirv_cross::Compiler::set_name((Compiler *)pSVar2,local_68,(string *)local_88);
          std::__cxx11::string::~string((string *)local_88);
          for (local_98[0] = 0; uVar1 = local_98[0],
              sVar4 = spirv_cross::VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                (&(local_60->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
              pSVar2 = resources_local, index = local_98[0], uVar1 < (uint)sVar4;
              local_98[0] = local_98[0] + 1) {
            local_9c.id = (_loc->base_type_id).id;
            spirv_cross::join<char_const(&)[16],unsigned_int&>
                      (local_c0,(char (*) [16])"InterfaceMember",local_98);
            spirv_cross::Compiler::set_member_name
                      ((Compiler *)pSVar2,local_9c,index,(string *)local_c0);
            std::__cxx11::string::~string((string *)local_c0);
          }
        }
        spirv_cross::Compiler::set_name
                  ((Compiler *)resources_local,(ID)(_loc->id).id,(string *)__range1);
      }
    }
  }
  return;
}

Assistant:

void rename_interface_variable(Compiler &compiler, const SmallVector<Resource> &resources, uint32_t location,
                               const std::string &name)
{
	for (auto &v : resources)
	{
		if (!compiler.has_decoration(v.id, spv::DecorationLocation))
			continue;

		auto loc = compiler.get_decoration(v.id, spv::DecorationLocation);
		if (loc != location)
			continue;

		auto &type = compiler.get_type(v.base_type_id);

		// This is more of a friendly variant. If we need to rename interface variables, we might have to rename
		// structs as well and make sure all the names match up.
		if (type.basetype == SPIRType::Struct)
		{
			compiler.set_name(v.base_type_id, join("SPIRV_Cross_Interface_Location", location));
			for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
				compiler.set_member_name(v.base_type_id, i, join("InterfaceMember", i));
		}

		compiler.set_name(v.id, name);
	}
}